

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytes.cc
# Opt level: O1

size_t xemmai::t_type_of<xemmai::t_bytes>::f_do_get_at(t_object *a_this,t_pvalue *a_stack)

{
  t_object *ptVar1;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar2;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *paVar3;
  long local_20;
  
  ptVar1 = a_stack[2].super_t_pointer.v_p;
  if ((ptVar1 != (t_object *)0x3) &&
     ((((ptVar1 < (t_object *)0x3 || (ptVar1 == (t_object *)0x4)) || (ptVar1->v_type->v_depth == 0))
      || ((undefined8 *)ptVar1->v_type->v_ids[1] != &v__type_id<long>)))) {
    f_do_get_at();
  }
  paVar3 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)ptVar1->v_data;
  if (ptVar1 < (t_object *)0x5) {
    paVar3 = &a_stack[2].field_0;
  }
  local_20 = paVar3->v_integer;
  t_bytes::f_validate((t_bytes *)a_this->v_data,&local_20);
  aVar2.v_integer._1_7_ = 0;
  aVar2.v_integer._0_1_ = a_this->v_data[local_20 + 8];
  (a_stack->super_t_pointer).v_p = (t_object *)0x3;
  a_stack->field_0 = aVar2;
  return 0xffffffffffffffff;
}

Assistant:

size_t t_type_of<t_bytes>::f_do_get_at(t_object* a_this, t_pvalue* a_stack)
{
	f_check<intptr_t>(a_stack[2], L"index");
	a_stack[0] = a_this->f_as<t_bytes>().f_get_at(f_as<intptr_t>(a_stack[2]));
	return -1;
}